

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O1

void Fxu_Update(Fxu_Matrix *p,Fxu_Single *pSingle,Fxu_Double *pDouble)

{
  Fxu_Var *pVar1;
  Fxu_Var *pVar2;
  int iVar1;
  int iVar2;
  Fxu_Var *pVar;
  Fxu_Var *pVar_00;
  Fxu_Cube *pFVar3;
  
  if (pSingle == (Fxu_Single *)0x0) {
    iVar1 = pDouble->Weight;
    iVar2 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
    if (iVar1 == iVar2) {
      Fxu_UpdateDouble(p);
      return;
    }
    __assert_fail("pDouble->Weight == Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                  ,0x42,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
  }
  if (pDouble == (Fxu_Double *)0x0) {
    iVar1 = pSingle->Weight;
    iVar2 = Fxu_HeapSingleReadMaxWeight(p->pHeapSingle);
    if (iVar1 == iVar2) {
      Fxu_UpdateSingle(p);
      return;
    }
    __assert_fail("pSingle->Weight == Fxu_HeapSingleReadMaxWeight( p->pHeapSingle )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                  ,0x48,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
  }
  pVar1 = pSingle->pVar1;
  pVar2 = pSingle->pVar2;
  Fxu_HeapDoubleDelete(p->pHeapDouble,pDouble);
  Fxu_ListTableDelDivisor(p,pDouble);
  pVar = Fxu_MatrixAddVar(p);
  pVar->nCubes = 0;
  pVar_00 = Fxu_MatrixAddVar(p);
  pVar_00->nCubes = 1;
  pFVar3 = Fxu_MatrixAddCube(p,pVar_00,0);
  pFVar3->pFirst = pFVar3;
  pVar_00->pFirst = pFVar3;
  p->ppTailCubes = &p->pOrderCubes;
  p->pOrderCubes = (Fxu_Cube *)0x0;
  p->pOrderVars = pVar1;
  p->ppTailVars = &pVar1->pOrder;
  pVar1->pOrder = pVar2;
  p->ppTailVars = &pVar2->pOrder;
  pVar2->pOrder = (Fxu_Var *)0x1;
  Fxu_UpdateMatrixSingleClean(p,pVar1,pVar2,pVar_00);
  Fxu_UpdateDoublePairs(p,pDouble,pVar);
  if (pVar2->iVar <= pVar1->iVar) {
    __assert_fail("pVar1->iVar < pVar2->iVar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                  ,0x70,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
  }
  iVar1 = Fxu_SingleCountCoincidence(p,pVar1,pVar2);
  if (iVar1 == 0) {
    Fxu_MatrixAddLiteral(p,pFVar3,pVar1);
    Fxu_MatrixAddLiteral(p,pFVar3,pVar2);
    pFVar3 = p->pOrderCubes;
    if ((Fxu_Cube *)0x1 < pFVar3) {
      do {
        Fxu_UpdateAddNewDoubles(p,pFVar3);
        pFVar3 = pFVar3->pOrder;
      } while (pFVar3 != (Fxu_Cube *)0x1);
    }
    Fxu_UpdateCleanOldSingles(p);
    Fxu_MatrixRingCubesUnmark(p);
    Fxu_MatrixRingVarsUnmark(p);
    Fxu_MatrixComputeSinglesOne(p,pVar);
    Fxu_MatrixComputeSinglesOne(p,pVar_00);
    Fxu_MemRecycle(p,(char *)pDouble,0x40);
    p->nDivs3 = p->nDivs3 + 1;
    return;
  }
  __assert_fail("Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                ,0x71,"void Fxu_Update(Fxu_Matrix *, Fxu_Single *, Fxu_Double *)");
}

Assistant:

void Fxu_Update( Fxu_Matrix * p, Fxu_Single * pSingle, Fxu_Double * pDouble )
{
    Fxu_Cube * pCube, * pCubeNew;
    Fxu_Var * pVarC, * pVarD;
    Fxu_Var * pVar1, * pVar2;

    // consider trivial cases
    if ( pSingle == NULL )
    {
        assert( pDouble->Weight == Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble ) );
        Fxu_UpdateDouble( p );
        return;
    }
    if ( pDouble == NULL )
    {
        assert( pSingle->Weight == Fxu_HeapSingleReadMaxWeight( p->pHeapSingle ) );
        Fxu_UpdateSingle( p );
        return;
    }

    // get the variables of the single
    pVar1 = pSingle->pVar1;
    pVar2 = pSingle->pVar2;

    // remove the best double from the heap
    Fxu_HeapDoubleDelete( p->pHeapDouble, pDouble );
    // remove the best divisor from the table
    Fxu_ListTableDelDivisor( p, pDouble );

    // create two new columns (vars)
    Fxu_UpdateCreateNewVars( p, &pVarC, &pVarD, 1 );
    // create one new row (cube)
    pCubeNew = Fxu_MatrixAddCube( p, pVarD, 0 );
    pCubeNew->pFirst = pCubeNew;
    // set the first cube of the positive var
    pVarD->pFirst = pCubeNew;

    // start collecting the affected vars and cubes
    Fxu_MatrixRingCubesStart( p );
    Fxu_MatrixRingVarsStart( p );
    // add the vars
    Fxu_MatrixRingVarsAdd( p, pVar1 );
    Fxu_MatrixRingVarsAdd( p, pVar2 );
    // remove the literals and collect the affected cubes
    // remove the divisors associated with this cube
       // add to the affected cube the literal corresponding to the new column
    Fxu_UpdateMatrixSingleClean( p, pVar1, pVar2, pVarD );
    // replace each two cubes of the pair by one new cube
    // the new cube contains the base and the new literal
    Fxu_UpdateDoublePairs( p, pDouble, pVarC );
    // stop collecting the affected vars and cubes
    Fxu_MatrixRingCubesStop( p );
    Fxu_MatrixRingVarsStop( p );

    // add the literals to the new cube
    assert( pVar1->iVar < pVar2->iVar );
    assert( Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar1 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar2 );

    // create new doubles; we cannot add them in the same loop
    // because we first have to create *all* new cubes for each node
    Fxu_MatrixForEachCubeInRing( p, pCube )
           Fxu_UpdateAddNewDoubles( p, pCube );
    // update the singles after removing some literals
    Fxu_UpdateCleanOldSingles( p );

    // undo the temporary rings with cubes and vars
    Fxu_MatrixRingCubesUnmark( p );
    Fxu_MatrixRingVarsUnmark( p );
    // we should undo the rings before creating new singles

    // create new singles
    Fxu_UpdateAddNewSingles( p, pVarC );
    Fxu_UpdateAddNewSingles( p, pVarD );

    // recycle the divisor
    MEM_FREE_FXU( p, Fxu_Double, 1, pDouble );
    p->nDivs3++;
}